

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::ShaderCompilerCase::setShaderInputs
          (ShaderCompilerCase *this,deUint32 program,ProgramContext *progCtx)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pAVar4;
  pointer pUVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  pAVar4 = (progCtx->vertexAttributes).
           super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(progCtx->vertexAttributes).
                              super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) >> 5) *
          -0x55555555) {
    lVar7 = 0x20;
    lVar8 = 0;
    do {
      iVar2 = (**(code **)(lVar3 + 0x780))
                        (program,*(undefined8 *)((long)(&pAVar4->value + -1) + lVar7));
      if (-1 < iVar2) {
        (**(code **)(lVar3 + 0x610))(iVar2);
        (**(code **)(lVar3 + 0x19f0))
                  (iVar2,4,0x1406,0,0,
                   (long)(((progCtx->vertexAttributes).
                           super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start)->value).m_data + lVar7 + -0x20
                  );
      }
      lVar8 = lVar8 + 1;
      pAVar4 = (progCtx->vertexAttributes).
               super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x60;
    } while (lVar8 < (int)((ulong)((long)(progCtx->vertexAttributes).
                                         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4)
                          >> 5) * -0x55555555);
  }
  pUVar5 = (progCtx->uniforms).
           super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(progCtx->uniforms).
                              super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 3) *
          -0x3b13b13b) {
    lVar8 = 0x24;
    lVar7 = 0;
    do {
      iVar2 = (**(code **)(lVar3 + 0xb48))
                        (program,*(undefined8 *)((long)(pUVar5->value).m_data + lVar8 + -0x48));
      if (-1 < iVar2) {
        pUVar5 = (progCtx->uniforms).
                 super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = *(uint *)((long)(pUVar5->value).m_data + lVar8 + -0x28);
        if (uVar1 < 7) {
          pfVar6 = (float *)((long)(pUVar5->value).m_data + lVar8 + -0x24);
          switch(uVar1) {
          case 0:
            (**(code **)(lVar3 + 0x14e8))(iVar2,1,pfVar6);
            break;
          case 1:
            (**(code **)(lVar3 + 0x1528))(iVar2,1,pfVar6);
            break;
          case 2:
            (**(code **)(lVar3 + 0x1568))(iVar2,1,pfVar6);
            break;
          case 3:
            (**(code **)(lVar3 + 0x15a8))(iVar2,1,pfVar6);
            break;
          case 4:
            (**(code **)(lVar3 + 0x1610))(iVar2,1,0);
            break;
          case 5:
            (**(code **)(lVar3 + 0x1640))(iVar2,1,0);
            break;
          case 6:
            (**(code **)(lVar3 + 0x14f0))
                      (iVar2,(int)(*pfVar6 + *(float *)(&DAT_01bdf0a0 + (ulong)(*pfVar6 < 0.0) * 4))
                      );
          }
        }
      }
      lVar7 = lVar7 + 1;
      pUVar5 = (progCtx->uniforms).
               super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x68;
    } while (lVar7 < (int)((ulong)((long)(progCtx->uniforms).
                                         super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5)
                          >> 3) * -0x3b13b13b);
  }
  return;
}

Assistant:

void ShaderCompilerCase::setShaderInputs (deUint32 program, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup attributes.

	for (int attribNdx = 0; attribNdx < (int)progCtx.vertexAttributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program, progCtx.vertexAttributes[attribNdx].name.c_str());
		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, progCtx.vertexAttributes[attribNdx].value.getPtr());
		}
	}

	// Setup uniforms.

	for (int uniformNdx = 0; uniformNdx < (int)progCtx.uniforms.size(); uniformNdx++)
	{
		int location = gl.getUniformLocation(program, progCtx.uniforms[uniformNdx].name.c_str());
		if (location >= 0)
		{
			const float* floatPtr = progCtx.uniforms[uniformNdx].value.getPtr();

			switch (progCtx.uniforms[uniformNdx].type)
			{
				case UniformSpec::TYPE_FLOAT:			gl.uniform1fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC2:			gl.uniform2fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC3:			gl.uniform3fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_VEC4:			gl.uniform4fv(location, 1, floatPtr);								break;
				case UniformSpec::TYPE_MAT3:			gl.uniformMatrix3fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_MAT4:			gl.uniformMatrix4fv(location, 1, GL_FALSE, floatPtr);				break;
				case UniformSpec::TYPE_TEXTURE_UNIT:	gl.uniform1i(location, (GLint)deRoundFloatToInt32(*floatPtr));		break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}